

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::precise::equations::convert_value_to_equnit(double val,unit_data *UT)

{
  bool bVar1;
  int iVar2;
  __type _Var3;
  double dVar4;
  double local_78;
  double local_60;
  double local_48;
  double out_1;
  double out;
  int logtype;
  unit_data *UT_local;
  double val_local;
  
  bVar1 = detail::unit_data::is_equation(UT);
  val_local = val;
  if (bVar1) {
    iVar2 = custom::eq_type(UT);
    if ((0xf < iVar2) || (0.0 < val)) {
      switch(iVar2) {
      case 0:
      case 10:
        val_local = log10(val);
        break;
      case 1:
        bVar1 = is_power_unit(UT);
        local_48 = 0.5;
        if (!bVar1) {
          local_48 = 1.0;
        }
        dVar4 = ::log(val);
        val_local = local_48 * dVar4;
        break;
      case 2:
        bVar1 = is_power_unit(UT);
        local_60 = 1.0;
        if (!bVar1) {
          local_60 = 2.0;
        }
        dVar4 = log10(val);
        val_local = local_60 * dVar4;
        break;
      case 3:
        bVar1 = is_power_unit(UT);
        local_78 = 10.0;
        if (!bVar1) {
          local_78 = 20.0;
        }
        dVar4 = log10(val);
        val_local = local_78 * dVar4;
        break;
      case 4:
        dVar4 = log10(val);
        val_local = -dVar4;
        break;
      case 5:
        dVar4 = log10(val);
        val_local = -dVar4 / 2.0;
        break;
      case 6:
        dVar4 = log10(val);
        val_local = -dVar4 / 3.0;
        break;
      case 7:
        dVar4 = log10(val);
        _Var3 = std::log10<int>(50000);
        val_local = -dVar4 / _Var3;
        break;
      case 8:
        val_local = log2(val);
        break;
      case 9:
        val_local = ::log(val);
        break;
      case 0xb:
        dVar4 = log10(val);
        val_local = dVar4 * 10.0;
        break;
      case 0xc:
        dVar4 = log10(val);
        val_local = dVar4 * 2.0;
        break;
      case 0xd:
        dVar4 = log10(val);
        val_local = dVar4 * 20.0;
        break;
      case 0xe:
        dVar4 = log10(val);
        _Var3 = std::log10<int>(3);
        val_local = dVar4 / _Var3;
        break;
      case 0xf:
        dVar4 = ::log(val);
        val_local = dVar4 * 0.5;
        break;
      case 0x10:
        val_local = 141.5 / val - 131.5;
        break;
      case 0x11:
        val_local = 140.0 / val - 130.0;
        break;
      case 0x12:
        val_local = (1.0 - 1.0 / val) * 145.0;
        break;
      default:
        break;
      case 0x16:
        dVar4 = fma(1.75748569529e-10,val,-9.09204303833e-08);
        dVar4 = fma(dVar4,val,1.5227445578e-05);
        dVar4 = fma(dVar4,val,-0.000773787973277);
        dVar4 = fma(dVar4,val,0.0281978682167);
        val_local = fma(dVar4,val,-0.667563481438);
        break;
      case 0x17:
        dVar4 = fma(2.18882896425e-08,val,-4.78236313769e-06);
        dVar4 = fma(dVar4,val,0.000391121840061);
        dVar4 = fma(dVar4,val,-0.0152427367162);
        dVar4 = fma(dVar4,val,0.424089585061);
        val_local = fma(dVar4,val,0.49924168937);
        break;
      case 0x18:
        dVar4 = pow(val / 14.1,0.6666666666666666);
        val_local = dVar4 - 2.0;
        break;
      case 0x1b:
        dVar4 = tan(val);
        val_local = dVar4 * 100.0;
        break;
      case 0x1d:
        dVar4 = log10(val);
        val_local = dVar4 * 0.6666666666666666 + -10.7;
        break;
      case 0x1e:
        dVar4 = log10(val);
        val_local = dVar4 * 0.6666666666666666 + -3.2;
      }
    }
    else {
      val_local = NAN;
    }
  }
  return val_local;
}

Assistant:

inline double
            convert_value_to_equnit(double val, const detail::unit_data& UT)
        {
            if (!UT.is_equation()) {
                return val;
            }
            int logtype = custom::eq_type(UT);
            if ((logtype < 16) && (val <= 0.0)) {
                return constants::invalid_conversion;
            }

            switch (logtype) {
                case 0:
                case 10:
                    return std::log10(val);
                case 1:
                    return ((is_power_unit(UT)) ? 0.5 : 1.0) * (std::log)(val);
                case 2:
                    return ((is_power_unit(UT)) ? 1.0 : 2.0) * std::log10(val);
                case 3:
                    return ((is_power_unit(UT)) ? 10.0 : 20.0) *
                        std::log10(val);
                case 4:
                    return -std::log10(val);
                case 5:
                    return -std::log10(val) / 2.0;
                case 6:
                    return -std::log10(val) / 3.0;
                case 7:
                    return -std::log10(val) / std::log10(50000);
                case 8:
                    return (std::log2)(val);
                case 9:
                    return (std::log)(val);
                case 11:
                    return 10.0 * std::log10(val);
                case 12:
                    return 2.0 * std::log10(val);
                case 13:
                    return 20.0 * std::log10(val);
                case 14:
                    return std::log10(val) / std::log10(3);
                case 15:
                    return 0.5 * (std::log)(val);
                case 16:  // API Gravity
                    return 141.5 / (val)-131.5;
                case 17:  // degree Baume Light
                    return 140.0 / val - 130;
                case 18:  // degree Baume Heavy
                    return 145.0 * (1.0 - 1.0 / val);
                case 22:  // saffir simpson hurricane scale from wind speed
                {  // using horners method on polynomial approximation of
                   // saffir-simpson wind speed scale
                    double out = 1.75748569529e-10;
                    out = std::fma(out, val, -9.09204303833e-08);
                    out = std::fma(out, val, 1.52274455780e-05);
                    out = std::fma(out, val, -7.73787973277e-04);
                    out = std::fma(out, val, 2.81978682167e-02);
                    out = std::fma(out, val, -6.67563481438e-01);
                    return out;
                }
                case 23: {  // Beaufort wind scale
                    double out = 2.18882896425e-08;
                    out = std::fma(out, val, -4.78236313769e-06);
                    out = std::fma(out, val, 3.91121840061e-04);
                    out = std::fma(out, val, -1.52427367162e-02);
                    out = std::fma(out, val, 4.24089585061e-01);
                    out = std::fma(out, val, 4.99241689370e-01);
                    return out;
                }
                case 24:  // fujita scale
                    return std::pow(val / 14.1, 2.0 / 3.0) - 2.0;
                case 27:  // prism diopter
                    return 100.0 * std::tan(val);
                case 29:  // moment magnitude scale
                    return 2.0 / 3.0 * std::log10(val) - 10.7;
                case 30:  // energy magnitude scale
                    return 2.0 / 3.0 * std::log10(val) - 3.2;
                default:
                    return val;
            }
        }